

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncError UTF8ToUTF8(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  xmlCharEncError xVar1;
  xmlCharEncError xVar2;
  xmlCharEncError xVar3;
  xmlCharEncError xVar4;
  
  if (in == (uchar *)0x0) {
    xVar4 = XML_ENC_ERR_SUCCESS;
    *inlen = 0;
    *outlen = 0;
  }
  else {
    xVar1 = *outlen;
    xVar2 = *inlen;
    xVar3 = xVar1;
    if (xVar2 <= xVar1) {
      xVar3 = xVar2;
    }
    xVar4 = XML_ENC_ERR_SPACE;
    if (xVar2 <= xVar1) {
      xVar4 = xVar2;
    }
    memcpy(out,in,(long)xVar3);
    *outlen = xVar3;
    *inlen = xVar3;
  }
  return xVar4;
}

Assistant:

static xmlCharEncError
UTF8ToUTF8(void *vctxt ATTRIBUTE_UNUSED,
           unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen,
           int flush ATTRIBUTE_UNUSED) {
    int len;
    int ret;

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    if (*outlen < *inlen) {
	len = *outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
	len = *inlen;
        ret = len;
    }

    memcpy(out, in, len);

    *outlen = len;
    *inlen = len;
    return(ret);
}